

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_keygen.c
# Opt level: O2

int ulp_ring_generate_key_pair
              (size_t n,uint64_t sk,uint64_t se,uint64_t q,ulp_ring_public_key **pub_key_p,
              ulp_ring_private_key **priv_key_p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulp_ring_public_key *pub_key;
  ulp_ring_private_key *priv_key;
  uint64_t *result;
  size_t sVar4;
  
  iVar1 = -2;
  if (((((-1 < (long)q) && (n != 0)) && (sk != 0)) && ((se != 0 && (q != 0)))) &&
     ((pub_key_p != (ulp_ring_public_key **)0x0 && (priv_key_p != (ulp_ring_private_key **)0x0)))) {
    pub_key = ulp_ring_alloc_public_key(n);
    priv_key = ulp_ring_alloc_private_key(n);
    result = (uint64_t *)malloc(n * 8);
    if (result != (uint64_t *)0x0 &&
        (priv_key != (ulp_ring_private_key *)0x0 && pub_key != (ulp_ring_public_key *)0x0)) {
      pub_key->se = se;
      pub_key->q = q;
      priv_key->q = q;
      iVar1 = get_random_numbers(pub_key->a,n,q);
      iVar2 = get_random_numbers(pub_key->p,n,sk);
      iVar3 = get_random_numbers(priv_key->s,n,sk);
      if ((iVar3 + iVar2 + iVar1 == 0) &&
         (iVar1 = poly_mulmod(priv_key->s,pub_key->a,n,q,result), iVar1 == 0)) {
        for (sVar4 = 0; n != sVar4; sVar4 = sVar4 + 1) {
          pub_key->p[sVar4] = ((pub_key->p[sVar4] + q) - result[sVar4]) % q;
        }
        free(result);
        *pub_key_p = pub_key;
        *priv_key_p = priv_key;
        return 0;
      }
    }
    ulp_ring_free_public_key(pub_key);
    ulp_ring_free_private_key(priv_key);
    free(result);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int ulp_ring_generate_key_pair(size_t n, uint64_t sk, uint64_t se, uint64_t q, ulp_ring_public_key** pub_key_p, ulp_ring_private_key** priv_key_p) {

    if(n == 0 || sk == 0 || se == 0 || q == 0 || pub_key_p == NULL || priv_key_p == NULL || q >= 0x8000000000000000)
        return -2;

    // allocate memory for keys
    ulp_ring_public_key* pub_key = ulp_ring_alloc_public_key(n);
    ulp_ring_private_key* priv_key = ulp_ring_alloc_private_key(n);
    uint64_t* sa = malloc(n*sizeof(uint64_t));
    if(pub_key == NULL || priv_key == NULL || sa == NULL)
        goto fail;

    // store parameters in key structs
    pub_key->se = se;
    pub_key->q = q;
    priv_key->q = q;

    // sample random data
    int err = 0;
    err += get_random_numbers(pub_key->a, n, q);
    err += get_random_numbers(pub_key->p, n, sk);
    err += get_random_numbers(priv_key->s, n, sk);
    if(err != 0)
        goto fail;

    // s*a
    if(poly_mulmod(priv_key->s, pub_key->a, n, q, sa) != 0)
        goto fail;

    // p = e - s*a
    for(size_t i = 0; i < n; i++) {
        pub_key->p[i] = (pub_key->p[i] + q - sa[i]) % q;
    }

    // exit properly
    free(sa);
    *pub_key_p = pub_key;
    *priv_key_p = priv_key;
    return 0;


    // on failure, do cleanup
    fail:
        ulp_ring_free_public_key(pub_key);
        ulp_ring_free_private_key(priv_key);
        free(sa);
        return -1;

}